

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  pointer pMVar2;
  TestCaseInfo *pTVar3;
  TeamCityReporter *pTVar4;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar5;
  size_t sVar6;
  ostream *poVar7;
  ulong uVar8;
  MessageInfo *messageInfo;
  pointer pMVar9;
  char *pcVar10;
  long lVar11;
  StringRef str;
  StringRef str_00;
  ReusableStringStream msg;
  char local_a9;
  string local_a8;
  string local_88;
  ReusableStringStream local_68;
  TeamCityReporter *local_58;
  char local_50;
  undefined7 uStack_4f;
  char *local_48;
  long local_40 [2];
  
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  if ((OVar1 != ExplicitSkip) &&
     (((byte)OVar1 >> 4 &
      ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0) == 0))
  goto LAB_0015c42b;
  pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar6 = StringStreams::add(&pSVar5->super_StringStreams);
  local_68.m_index = sVar6;
  pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar7 = (ostream *)
           (pSVar5->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar6].m_ptr;
  local_68.m_oss = poVar7;
  if (this->m_headerPrintedForThisSection == false) {
    printSectionHeader(this,poVar7);
  }
  this->m_headerPrintedForThisSection = true;
  local_a8._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_a8._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  operator<<(poVar7,(SourceLineInfo *)&local_a8);
  local_88._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_88,1);
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  uVar8 = (ulong)(uint)OVar1;
  if (Exception < OVar1) {
    if (OVar1 == ThrewException) {
      uVar8 = 0x14;
      pcVar10 = "unexpected exception";
    }
    else if (OVar1 == DidntThrowException) {
      uVar8 = 0x2e;
      pcVar10 = "no exception was thrown where one was expected";
    }
    else {
      if (OVar1 != FatalErrorCondition) goto switchD_0015c0ba_caseD_3;
      uVar8 = 0x15;
      pcVar10 = "fatal error condition";
    }
    goto LAB_0015c121;
  }
  switch(OVar1) {
  case Ok:
  case Info:
  case Warning:
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88._M_string_length,"Internal error in TeamCity reporter",0x23);
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_a8);
  case Warning|Info:
  case ExplicitSkip|Info:
  case ExplicitSkip|Warning:
  case ExplicitSkip|Warning|Info:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    goto switchD_0015c0ba_caseD_3;
  case ExplicitSkip:
    uVar8 = 0xd;
    pcVar10 = "explicit skip";
    break;
  case ExpressionFailed:
    pcVar10 = "expression failed";
    break;
  case ExplicitFailure:
    uVar8 = 0x10;
    pcVar10 = "explicit failure";
    break;
  case Unknown:
  case FailureBit:
switchD_0015c0ba_caseD_ffffffff:
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88._M_string_length,"Not implemented",0xf);
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_a8);
  default:
    if (OVar1 == Exception) goto switchD_0015c0ba_caseD_ffffffff;
    goto switchD_0015c0ba_caseD_3;
  }
LAB_0015c121:
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,uVar8);
switchD_0015c0ba_caseD_3:
  if ((long)(assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start == 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," with message:",0xe);
  }
  uVar8 = ((long)(assertionStats->infoMessages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(assertionStats->infoMessages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if (1 < uVar8) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," with messages:",0xf);
  }
  pMVar9 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = this;
  if (pMVar9 != pMVar2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n  \"",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(pMVar9->message)._M_dataplus._M_p,(pMVar9->message)._M_string_length);
      local_a8._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_a8,1);
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar2);
  }
  pTVar4 = local_58;
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n  ",3);
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a8,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nwith expansion:\n  ",0x13);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_88,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                       local_88._M_dataplus._M_p._0_1_),local_88._M_string_length);
    local_50 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_50,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                      local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  lVar11 = 0x16;
  pcVar10 = "##teamcity[testIgnored";
  if ((assertionStats->assertionResult).m_resultData.resultType != ExplicitSkip) {
    if ((((pTVar4->super_StreamingReporterBase).currentTestCaseInfo)->properties &
        (MayFail|ShouldFail)) == None) {
      lVar11 = 0x15;
      pcVar10 = "##teamcity[testFailed";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_68.m_oss,"- failure ignore as test marked as \'ok to fail\'\n",0x30);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((pTVar4->super_StreamingReporterBase).super_ReporterBase.m_stream,pcVar10,lVar11);
  poVar7 = (pTVar4->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," name=\'",7);
  pTVar3 = (pTVar4->super_StreamingReporterBase).currentTestCaseInfo;
  str.m_size = uVar8;
  str.m_start = (char *)(pTVar3->name)._M_string_length;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_a8,(_anonymous_namespace_ *)(pTVar3->name)._M_dataplus._M_p,str);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  local_88._M_dataplus._M_p._0_1_ = 0x27;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_88,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," message=\'",10);
  std::__cxx11::stringbuf::str();
  str_00.m_size = uVar8;
  str_00.m_start = local_48;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_88,(_anonymous_namespace_ *)CONCAT71(uStack_4f,local_50),str_00);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                              local_88._M_dataplus._M_p._0_1_),
                      local_88._M_string_length);
  local_a9 = '\'';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
      &local_88.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                    local_88.field_2._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_68);
LAB_0015c42b:
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::assertionEnded(AssertionStats const& assertionStats) {
        AssertionResult const& result = assertionStats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;
            case ResultWas::ExplicitSkip:
                msg << "explicit skip";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const& messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                m_stream << "##teamcity[testIgnored";
            } else if ( currentTestCaseInfo->okToFail() ) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                m_stream << "##teamcity[testIgnored";
            } else {
                m_stream << "##teamcity[testFailed";
            }
            m_stream << " name='" << escape( currentTestCaseInfo->name ) << '\''
                     << " message='" << escape( msg.str() ) << '\'' << "]\n";
        }
        m_stream.flush();
    }